

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::Btree_multiset_int32_Test::TestBody(Btree_multiset_int32_Test *this)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined1 auVar3 [8];
  _Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  node;
  size_type sVar4;
  ulong uVar5;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
  _Var6;
  void *__s;
  pointer p;
  pointer pbVar7;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
  _Var8;
  vector<int,_std::allocator<int>_> *extraout_RDX;
  vector<int,_std::allocator<int>_> *extraout_RDX_00;
  vector<int,_std::allocator<int>_> *values;
  undefined8 extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *values_00;
  vector<int,_std::allocator<int>_> *values_01;
  vector<int,_std::allocator<int>_> *values_02;
  vector<int,_std::allocator<int>_> *values_03;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  n;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_03;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_05;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_06;
  size_type n_00;
  int i_2;
  long lVar9;
  pointer *__ptr;
  int i;
  int iVar10;
  pointer message;
  char *pcVar11;
  btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
  *__tmp;
  value_type *__val;
  bool bVar12;
  AssertionResult AVar13;
  int64_t original_bytes1_2;
  vector<int,_std::allocator<int>_> random_values;
  vector<int,_std::allocator<int>_> sorted_values;
  vector<int,_std::allocator<int>_> duplicate_values;
  multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
  container;
  int64_t bytes2;
  PropagatingCountingAlloc<phmap::btree_multiset<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
  allocator2;
  PropagatingCountingAlloc<phmap::btree_multiset<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
  allocator1;
  AssertHelper local_118;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_110;
  AssertHelper local_108;
  undefined1 local_100 [8];
  _Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_false> local_f8
  ;
  _Base_ptr p_Stack_f0;
  AssertHelperData *local_e8;
  undefined1 local_e0 [8];
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
  local_d8;
  _Base_ptr local_d0;
  vector<int,_std::allocator<int>_> local_c8;
  btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
  local_b0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_90;
  void *local_60;
  long local_58;
  long local_50;
  pointer local_48;
  CountingAllocator<int> local_40;
  CountingAllocator<int> local_38;
  
  (anonymous_namespace)::ConstTest<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>>
            ();
  GenerateValuesWithSeed<int>
            ((vector<int,_std::allocator<int>_> *)local_100,10000,40000,
             testing::FLAGS_gtest_random_seed);
  local_b0.size_ = (size_type)&local_b0;
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
        )&btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>::
          EmptyNode()::empty_node;
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_false>.
  _M_head_impl.super_CountingAllocator<int>.bytes_used_ =
       (PropagatingCountingAlloc<int>)
       &btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>::
        EmptyNode()::empty_node;
  local_b0.rightmost_ = (node_type *)0x0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_e0,
             (vector<int,_std::allocator<int>_> *)local_100);
  _Var8._M_head_impl = local_d8._M_head_impl;
  auVar3 = local_e0;
  values = extraout_RDX;
  if (local_e0 != (undefined1  [8])local_d8._M_head_impl) {
    uVar5 = (long)local_d8._M_head_impl - (long)local_e0 >> 2;
    lVar9 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_e0,local_d8._M_head_impl,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (auVar3,_Var8._M_head_impl);
    values = extraout_RDX_00;
  }
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>,int>
            ((char *)&local_b0,
             (multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
              *)local_e0,values);
  values_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT71((int7)((ulong)extraout_RDX_01 >> 8),
                       local_e0 != (undefined1  [8])local_d8._M_head_impl);
  _Var8._M_head_impl = local_d8._M_head_impl + -4;
  if ((ulong)local_e0 < _Var8._M_head_impl && local_e0 != (undefined1  [8])local_d8._M_head_impl) {
    _Var6._M_head_impl =
         (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
          *)((long)local_e0 + 4);
    do {
      uVar2 = *(undefined4 *)(_Var6._M_head_impl + -4);
      *(undefined4 *)(_Var6._M_head_impl + -4) = *(undefined4 *)_Var8._M_head_impl;
      *(undefined4 *)_Var8._M_head_impl = uVar2;
      _Var8._M_head_impl = _Var8._M_head_impl + -4;
      values_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (_Var6._M_head_impl + 4);
      bVar12 = _Var6._M_head_impl < _Var8._M_head_impl;
      _Var6._M_head_impl =
           (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
            *)values_00;
    } while (bVar12);
  }
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>,int>
            ((char *)&local_b0,
             (multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
              *)local_e0,(vector<int,_std::allocator<int>_> *)values_00);
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>,int>
            ((char *)&local_b0,
             (multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
              *)local_100,values_01);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_c8,(vector<int,_std::allocator<int>_> *)local_100);
  std::vector<int,std::allocator<int>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
            ((vector<int,std::allocator<int>> *)&local_c8,
             local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish,local_100,local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_);
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>,int>
            ((char *)&local_b0,
             (multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
              *)&local_c8,values_02);
  __s = operator_new(400);
  lVar9 = 0;
  local_60 = __s;
  local_50 = (long)__s + 400;
  memset(__s,0,400);
  do {
    puVar1 = (undefined8 *)((long)__s + lVar9 * 4);
    *puVar1 = 0x200000002;
    puVar1[1] = 0x200000002;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 100);
  local_58 = (long)__s + 400;
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>,int>
            ((char *)&local_b0,
             (multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
              *)&local_60,values_03);
  operator_delete(__s,400);
  if ((_Base_ptr)
      local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (_Base_ptr)0x0) {
    operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
       )local_e0 !=
      (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_> *
      )0x0) {
    operator_delete((void *)local_e0,(long)local_d0 - (long)local_e0);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_90);
  btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::~btree
            ((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
              *)&local_b0);
  if (local_100 != (undefined1  [8])0x0) {
    operator_delete((void *)local_100,(long)p_Stack_f0 - (long)local_100);
  }
  local_60 = (void *)0x0;
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_00000020;
  local_40.bytes_used_ = (int64_t *)&local_60;
  local_38.bytes_used_ = (int64_t *)&local_c8;
  p = (pointer)operator_new(0x20);
  local_60 = (void *)((long)local_60 + 0x20);
  pbVar7 = (pointer)operator_new(0x20);
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
        )btree<phmap::priv::set_params<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,256,true>>
         ::EmptyNode()::empty_node;
  local_b0.rightmost_ =
       (node_type *)
       btree<phmap::priv::set_params<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,256,true>>
       ::EmptyNode()::empty_node;
  local_b0.size_ = 0;
  local_e0 = (undefined1  [8])
             local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  local_100 = (undefined1  [8])((ulong)(uint)local_100._4_4_ << 0x20);
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_false>.
  _M_head_impl.super_CountingAllocator<int>.bytes_used_ =
       (PropagatingCountingAlloc<int>)(PropagatingCountingAlloc<int>)&local_c8;
  btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
  ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
            *)&local_b0,(value_type *)local_100);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_100,"bytes1","original_bytes1",(long *)&local_c8,(long *)local_e0);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((CountingAllocator<int>)local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_ ==
        (CountingAllocator<int>)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2be,pcVar11);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  if ((CountingAllocator<int>)local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_ !=
      (CountingAllocator<int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_);
  }
  if (local_b0.size_ != 0) {
    btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
    ::internal_clear(&local_b0,
                     (node_type *)
                     local_b0.root_.
                     super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
                     ._M_head_impl);
  }
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
        )btree<phmap::priv::set_params<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,256,true>>
         ::EmptyNode()::empty_node;
  local_b0.rightmost_ =
       (node_type *)
       btree<phmap::priv::set_params<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,256,true>>
       ::EmptyNode()::empty_node;
  local_b0.size_ = 0;
  local_110._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_118.data_ = (AssertHelperData *)((ulong)local_118.data_._4_4_ << 0x20);
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_false>.
  _M_head_impl.super_CountingAllocator<int>.bytes_used_ =
       (PropagatingCountingAlloc<int>)(PropagatingCountingAlloc<int>)&local_60;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_100,"b1.size()","0",(unsigned_long *)&local_110,(int *)&local_118);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((CountingAllocator<int>)local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_ ==
        (CountingAllocator<int>)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c2,pcVar11);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  if ((CountingAllocator<int>)local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_ !=
      (CountingAllocator<int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_);
  }
  local_110._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_118.data_ = local_118.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_100,"b2.size()","0",(unsigned_long *)&local_110,(int *)&local_118);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if (local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_ ==
        (CountingAllocator<int>)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c3,pcVar11);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  if (local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_ != (CountingAllocator<int>)0x0)
  {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_);
  }
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_100,"bytes1","original_bytes1",(long *)&local_c8,(long *)local_e0);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((CountingAllocator<int>)local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_ ==
        (CountingAllocator<int>)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c4,pcVar11);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  local_48 = pbVar7;
  if ((CountingAllocator<int>)local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_ !=
      (CountingAllocator<int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_);
  }
  iVar10 = 1;
  do {
    local_100._0_4_ = iVar10;
    btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
    ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
              *)&local_b0,(value_type *)local_100);
    iVar10 = iVar10 + 1;
  } while (iVar10 != 1000);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_100,"bytes2","bytes1",(long *)&local_60,(long *)&local_c8);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if (local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_ ==
        (CountingAllocator<int>)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2cb,pcVar11);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  if (local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_ != (CountingAllocator<int>)0x0)
  {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_);
  }
  if (local_b0.size_ != 0) {
    btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
    ::internal_clear(&local_b0,
                     (node_type *)
                     local_b0.root_.
                     super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
                     ._M_head_impl);
  }
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
        )btree<phmap::priv::set_params<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,256,true>>
         ::EmptyNode()::empty_node;
  local_b0.rightmost_ =
       (node_type *)
       btree<phmap::priv::set_params<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,256,true>>
       ::EmptyNode()::empty_node;
  local_b0.size_ = 0;
  local_e0 = (undefined1  [8])
             local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  local_100 = (undefined1  [8])((ulong)local_100 & 0xffffffff00000000);
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_false>.
  _M_head_impl.super_CountingAllocator<int>.bytes_used_ =
       (PropagatingCountingAlloc<int>)(PropagatingCountingAlloc<int>)&local_c8;
  btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
  ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
            *)&local_b0,(value_type *)local_100);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_100,"bytes1","original_bytes1",(long *)&local_c8,(long *)local_e0);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((CountingAllocator<int>)local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_ ==
        (CountingAllocator<int>)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d5,pcVar11);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  if ((CountingAllocator<int>)local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_ !=
      (CountingAllocator<int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_);
  }
  if (local_b0.size_ != 0) {
    btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
    ::internal_clear(&local_b0,
                     (node_type *)
                     local_b0.root_.
                     super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
                     ._M_head_impl);
  }
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
        )btree<phmap::priv::set_params<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,256,true>>
         ::EmptyNode()::empty_node;
  local_b0.rightmost_ =
       (node_type *)
       btree<phmap::priv::set_params<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,256,true>>
       ::EmptyNode()::empty_node;
  local_b0.size_ = 0;
  local_110._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_118.data_ = local_118.data_ & 0xffffffff00000000;
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_false>.
  _M_head_impl.super_CountingAllocator<int>.bytes_used_ =
       (PropagatingCountingAlloc<int>)(PropagatingCountingAlloc<int>)&local_60;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_100,"b1.size()","0",(unsigned_long *)&local_110,(int *)&local_118);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((CountingAllocator<int>)local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_ ==
        (CountingAllocator<int>)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d9,pcVar11);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  if ((CountingAllocator<int>)local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_ !=
      (CountingAllocator<int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_);
  }
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_100,"bytes1","original_bytes1",(long *)&local_c8,(long *)local_e0);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if (local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_ ==
        (CountingAllocator<int>)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2da,pcVar11);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  if (local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_ != (CountingAllocator<int>)0x0)
  {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_);
  }
  iVar10 = 1;
  do {
    local_100._0_4_ = iVar10;
    btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
    ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
              *)&local_b0,(value_type *)local_100);
    iVar10 = iVar10 + 1;
  } while (iVar10 != 1000);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_100,"bytes2","bytes1",(long *)&local_60,(long *)&local_c8);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((CountingAllocator<int>)local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_ ==
        (CountingAllocator<int>)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2e1,pcVar11);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
  }
  if ((CountingAllocator<int>)local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_ !=
      (CountingAllocator<int>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_);
  }
  if (local_b0.size_ != 0) {
    btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
    ::internal_clear(&local_b0,
                     (node_type *)
                     local_b0.root_.
                     super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
                     ._M_head_impl);
  }
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
        )btree<phmap::priv::set_params<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,256,true>>
         ::EmptyNode()::empty_node;
  local_b0.rightmost_ =
       (node_type *)
       btree<phmap::priv::set_params<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,256,true>>
       ::EmptyNode()::empty_node;
  local_b0.size_ = 0;
  local_110._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_e0 = (undefined1  [8])((ulong)local_e0 & 0xffffffff00000000);
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_false>.
  _M_head_impl.super_CountingAllocator<int>.bytes_used_ =
       (PropagatingCountingAlloc<int>)(PropagatingCountingAlloc<int>)&local_c8;
  btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
  ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
            *)&local_b0,(value_type *)local_e0);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_e0,"bytes1","original_bytes1",(long *)&local_c8,(long *)&local_110);
  if (local_e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (pointer)0x3f69bf;
    }
    else {
      message = (((_Vector_base<int,_std::allocator<int>_> *)&(local_d8._M_head_impl)->field_0x0)->
                _M_impl).super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2eb,(char *)message);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_118.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_118.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_d8._M_head_impl);
  }
  sVar4 = local_b0.size_;
  node.
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
        )(_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
          )local_b0.root_.
           super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
           .
           super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
           .
           super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  ;
  local_f8._M_head_impl.super_CountingAllocator<int>.bytes_used_ =
       local_b0.root_.
       super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
       .
       super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
       .
       super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_false>
       ._M_head_impl.super_CountingAllocator<int>.bytes_used_;
  p_Stack_f0 = (_Base_ptr)local_b0.rightmost_;
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
        )btree<phmap::priv::set_params<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,256,true>>
         ::EmptyNode()::empty_node;
  local_100 = (undefined1  [8])
              node.
              super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
              ._M_head_impl;
  local_b0.rightmost_ =
       (node_type *)
       btree<phmap::priv::set_params<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,256,true>>
       ::EmptyNode()::empty_node;
  local_b0.size_ = 0;
  local_e8 = (AssertHelperData *)sVar4;
  local_118.data_ = (AssertHelperData *)0x0;
  local_108.data_._0_4_ = 0;
  local_b0.root_.
  super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
  .super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_false>.
  _M_head_impl.super_CountingAllocator<int>.bytes_used_ =
       (PropagatingCountingAlloc<int>)(PropagatingCountingAlloc<int>)&local_60;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_e0,"b1.size()","0",(unsigned_long *)&local_118,(int *)&local_108);
  if (local_e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = ((_Alloc_hider *)&(local_d8._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2ef,pcVar11);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_118.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_118.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_d8._M_head_impl);
  }
  local_118.data_ = (AssertHelperData *)sVar4;
  local_108.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_e0,"b2.size()","1",(unsigned_long *)&local_118,(int *)&local_108);
  if (local_e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = ((_Alloc_hider *)&(local_d8._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f0,pcVar11);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_118.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_118.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_d8._M_head_impl);
  }
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_e0,"bytes1","original_bytes1",(long *)&local_c8,(long *)&local_110);
  if (local_e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = ((_Alloc_hider *)&(local_d8._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f1,pcVar11);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_118.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_118.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_d8._M_head_impl);
  }
  iVar10 = 1;
  do {
    local_e0._0_4_ = iVar10;
    btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
    ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
              *)&local_b0,(value_type *)local_e0);
    iVar10 = iVar10 + 1;
  } while (iVar10 != 1000);
  AVar13 = testing::internal::CmpHelperGT<long,long>
                     ((internal *)local_e0,"bytes2","bytes1",(long *)&local_60,(long *)&local_c8);
  n._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar13.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = ((_Alloc_hider *)&(local_d8._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f8,pcVar11);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    n = extraout_RDX_02.
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl;
    if (local_118.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_118.data_ + 8))();
      n._M_head_impl = extraout_RDX_03;
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_d8._M_head_impl);
    n._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_04.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  if ((AssertHelperData *)sVar4 != (AssertHelperData *)0x0) {
    btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
    ::internal_clear((btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
                      *)local_100,
                     (node_type *)
                     node.
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
                     ._M_head_impl);
    n._M_head_impl = extraout_RDX_05;
  }
  if (local_b0.size_ != 0) {
    btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
    ::internal_clear(&local_b0,
                     (node_type *)
                     local_b0.root_.
                     super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*,_false>
                     ._M_head_impl);
    n._M_head_impl = extraout_RDX_06._M_head_impl;
  }
  CountingAllocator<phmap::btree_multiset<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
  ::deallocate((CountingAllocator<phmap::btree_multiset<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
                *)&local_38,p,(size_type)n._M_head_impl);
  CountingAllocator<phmap::btree_multiset<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
  ::deallocate((CountingAllocator<phmap::btree_multiset<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
                *)&local_40,local_48,n_00);
  return;
}

Assistant:

void BtreeMultiTest() {
        ConstTest<T>();

        using V = typename remove_pair_const<typename T::value_type>::type;
        const std::vector<V> random_values = GenerateValuesWithSeed<V>(
            test_values, 4 * test_values,
            GTEST_FLAG_GET(random_seed));

        multi_checker<T, C> container;

        // Test keys in sorted order.
        std::vector<V> sorted_values(random_values);
        std::sort(sorted_values.begin(), sorted_values.end());
        DoTest("sorted:    ", &container, sorted_values);

        // Test keys in reverse sorted order.
        std::reverse(sorted_values.begin(), sorted_values.end());
        DoTest("rsorted:   ", &container, sorted_values);

        // Test keys in random order.
        DoTest("random:    ", &container, random_values);

        // Test keys in random order w/ duplicates.
        std::vector<V> duplicate_values(random_values);
        duplicate_values.insert(duplicate_values.end(), random_values.begin(),
                                random_values.end());
        DoTest("duplicates:", &container, duplicate_values);

        // Test all identical keys.
        std::vector<V> identical_values(100);
        std::fill(identical_values.begin(), identical_values.end(),
                  Generator<V>(2)(2));
        DoTest("identical: ", &container, identical_values);
    }